

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

void __thiscall HEVCStreamReader::incTimings(HEVCStreamReader *this)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = (this->super_MPEGStreamReader).m_totalFrameNum;
  (this->super_MPEGStreamReader).m_totalFrameNum = iVar5 + 1;
  if (iVar5 < 1) {
    lVar2 = (this->super_MPEGStreamReader).m_curDts;
    lVar4 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  else {
    lVar4 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    lVar2 = (this->super_MPEGStreamReader).m_curDts + lVar4;
    (this->super_MPEGStreamReader).m_curDts = lVar2;
  }
  iVar5 = this->m_frameNum;
  lVar6 = (long)iVar5 - (long)this->m_fullPicOrder;
  (this->super_MPEGStreamReader).m_curPts = lVar2 - lVar6 * lVar4;
  this->m_frameNum = iVar5 + 1;
  this->m_firstFrame = false;
  iVar5 = (int)lVar6;
  if (this->m_frameDepth < iVar5) {
    iVar1 = 4;
    if (iVar5 < 4) {
      iVar1 = iVar5;
    }
    this->m_frameDepth = iVar1;
    poVar3 = std::operator<<((ostream *)&std::cout,"B-pyramid level ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_frameDepth + -1);
    poVar3 = std::operator<<(poVar3," detected. Shift DTS to ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_frameDepth);
    poVar3 = std::operator<<(poVar3," frames");
    std::endl<char,std::char_traits<char>>(poVar3);
    sLastMsg = true;
  }
  return;
}

Assistant:

void HEVCStreamReader::incTimings()
{
    if (m_totalFrameNum++ > 0)
        m_curDts += m_pcrIncPerFrame;
    const int delta = m_frameNum - m_fullPicOrder;
    m_curPts = m_curDts - delta * m_pcrIncPerFrame;
    m_frameNum++;
    m_firstFrame = false;

    if (delta > m_frameDepth)
    {
        m_frameDepth = FFMIN(4, delta);
        LTRACE(LT_INFO, 2,
               "B-pyramid level " << m_frameDepth - 1 << " detected. Shift DTS to " << m_frameDepth << " frames");
    }
}